

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O0

void tvm::runtime::ImportModuleBlob
               (char *mblob,
               vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *mlist)

{
  byte bVar1;
  bool bVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  PackedFunc *args;
  undefined1 local_700 [24];
  Module m;
  PackedFunc *f;
  string fkey;
  undefined1 local_3a8 [8];
  string tkey;
  uint64_t i_1;
  ulong local_1f8;
  uint64_t size;
  Stream *stream;
  MemoryFixedSizeStream fs;
  uint64_t c;
  size_t i;
  uint64_t nbytes;
  LogMessageFatal local_1a0;
  vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *local_18;
  vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *mlist_local;
  char *mblob_local;
  
  local_18 = mlist;
  mlist_local = (vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *)mblob;
  if (mblob == (char *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x27);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a0);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: mblob != nullptr");
    std::operator<<(poVar4,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  i = 0;
  for (c = 0; c < 8; c = c + 1) {
    bVar1 = *(byte *)((long)&(mlist_local->
                             super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>
                             )._M_impl.super__Vector_impl_data._M_start + c);
    fs.curr_ptr_ = (size_t)(char)bVar1;
    i = (ulong)bVar1 << ((byte)(c << 3) & 0x3f) | i;
  }
  dmlc::MemoryFixedSizeStream::MemoryFixedSizeStream
            ((MemoryFixedSizeStream *)&stream,
             &(mlist_local->
              super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>).
              _M_impl.super__Vector_impl_data._M_finish,i);
  size = (uint64_t)&stream;
  bVar2 = dmlc::Stream::Read<unsigned_long>((Stream *)&stream,&local_1f8);
  if (!bVar2) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i_1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x31);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&i_1);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: stream->Read(&size)");
    std::operator<<(poVar4,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i_1);
  }
  for (tkey.field_2._8_8_ = 0; (ulong)tkey.field_2._8_8_ < local_1f8;
      tkey.field_2._8_8_ = tkey.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_3a8);
    bVar2 = dmlc::Stream::Read<std::__cxx11::string>
                      ((Stream *)size,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3a8);
    if (!bVar2) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)((long)&fkey.field_2 + 8),
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                 ,0x34);
      poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_
                         ((LogMessageFatal *)((long)&fkey.field_2 + 8));
      poVar4 = std::operator<<((ostream *)poVar3,"Check failed: stream->Read(&tkey)");
      std::operator<<(poVar4,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)((long)&fkey.field_2 + 8));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   "module.loadbinary_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    args = Registry::Get((string *)&f);
    if (args == (PackedFunc *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)
                 &m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                 ,0x37);
      poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_
                         ((LogMessageFatal *)
                          &m.node_.
                           super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      poVar4 = std::operator<<((ostream *)poVar3,"Check failed: f != nullptr");
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"Loader of ");
      poVar4 = std::operator<<(poVar4,(string *)local_3a8);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = std::operator<<(poVar4,(string *)&f);
      std::operator<<(poVar4,") is not presented.");
      dmlc::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)
                 &m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    PackedFunc::operator()((PackedFunc *)local_700,(void **)args);
    TVMRetValue::operator_cast_to_Module((TVMRetValue *)(local_700 + 0x10));
    TVMRetValue::~TVMRetValue((TVMRetValue *)local_700);
    std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>::push_back
              (local_18,(value_type *)(local_700 + 0x10));
    Module::~Module((Module *)(local_700 + 0x10));
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)local_3a8);
  }
  dmlc::MemoryFixedSizeStream::~MemoryFixedSizeStream((MemoryFixedSizeStream *)&stream);
  return;
}

Assistant:

void ImportModuleBlob(const char *mblob, std::vector<Module> *mlist) {
#ifndef _LIBCPP_SGX_CONFIG
  CHECK(mblob != nullptr);
  uint64_t nbytes = 0;
  for (size_t i = 0; i < sizeof(nbytes); ++i) {
    uint64_t c = mblob[i];
    nbytes |= (c & 0xffUL) << (i * 8);
  }
  dmlc::MemoryFixedSizeStream fs(
      const_cast<char *>(mblob + sizeof(nbytes)), static_cast<size_t>(nbytes));
  dmlc::Stream *stream = &fs;
  uint64_t size;
  CHECK(stream->Read(&size));
  for (uint64_t i = 0; i < size; ++i) {
    std::string tkey;
    CHECK(stream->Read(&tkey));
    std::string fkey = "module.loadbinary_" + tkey;
    const PackedFunc *f = Registry::Get(fkey);
    CHECK(f != nullptr)
        << "Loader of " << tkey << "("
        << fkey << ") is not presented.";
    Module m = (*f)(static_cast<void *>(stream));
    mlist->push_back(m);
  }
#else
  LOG(FATAL) << "SGX does not support ImportModuleBlob";
#endif
}